

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.hpp
# Opt level: O0

void __thiscall Heap<Astar<Tiles>::Node>::push(Heap<Astar<Tiles>::Node> *this,Node *n)

{
  uint uVar1;
  ulong uVar2;
  size_type sVar3;
  Maxq *in_RSI;
  int *in_RDI;
  int p0;
  undefined4 in_stack_ffffffffffffffe8;
  
  uVar1 = (uint)(char)in_RSI->fill;
  uVar2 = (ulong)uVar1;
  sVar3 = std::
          vector<Heap<Astar<Tiles>::Node>::Maxq,_std::allocator<Heap<Astar<Tiles>::Node>::Maxq>_>::
          size((vector<Heap<Astar<Tiles>::Node>::Maxq,_std::allocator<Heap<Astar<Tiles>::Node>::Maxq>_>
                *)(in_RDI + 2));
  if (uVar2 < sVar3) {
    if ((int)uVar1 < in_RDI[1]) {
      in_RDI[1] = uVar1;
    }
    std::vector<Heap<Astar<Tiles>::Node>::Maxq,_std::allocator<Heap<Astar<Tiles>::Node>::Maxq>_>::
    operator[]((vector<Heap<Astar<Tiles>::Node>::Maxq,_std::allocator<Heap<Astar<Tiles>::Node>::Maxq>_>
                *)(in_RDI + 2),(long)(int)uVar1);
    Maxq::push(in_RSI,(Node *)CONCAT44(uVar1,in_stack_ffffffffffffffe8),0);
    *in_RDI = *in_RDI + 1;
    return;
  }
  __assert_fail("(unsigned int) p0 < qs.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/shunjilin[P]15PuzzleExternalMemorySearch/src/heap.hpp"
                ,0x4c,
                "void Heap<Astar<Tiles>::Node>::push(HeapElm *) [HeapElm = Astar<Tiles>::Node]");
}

Assistant:

void push(HeapElm *n) {
		int p0 = n->f;
 
		assert ((unsigned int) p0 < qs.size());

		if (p0 < min)
			min = p0;

		qs[p0].push(n, n->g);
		fill++;
	}